

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_guardcc(ASMState *as,int cc)

{
  MCLabel target_00;
  uint in_ESI;
  ASMState *in_RDI;
  MCode *p;
  MCode *target;
  ptrdiff_t delta;
  MCode *local_48;
  uint local_3c;
  
  local_48 = in_RDI->J->exitstubgroup[in_RDI->snapno >> 5] + ((in_RDI->snapno & 0x1f) << 2);
  target_00 = in_RDI->mcp;
  local_3c = in_ESI;
  if (target_00 == in_RDI->invmcp) {
    in_RDI->loopinv = 1;
    *(int *)(target_00 + 1) = (int)local_48 - ((int)target_00 + 5);
    local_3c = in_ESI ^ 1;
    local_48 = target_00;
    if (in_RDI->realign != (MCode *)0x0) {
      emit_sjcc(in_RDI,local_3c,target_00);
      return;
    }
  }
  emit_jcc(in_RDI,local_3c,local_48);
  return;
}

Assistant:

static void asm_guardcc(ASMState *as, int cc)
{
  MCode *target = exitstub_addr(as->J, as->snapno);
  MCode *p = as->mcp;
  if (LJ_UNLIKELY(p == as->invmcp)) {
    as->loopinv = 1;
    *(int32_t *)(p+1) = jmprel(as->J, p+5, target);
    target = p;
    cc ^= 1;
    if (as->realign) {
      if (LJ_GC64 && LJ_UNLIKELY(as->mrm.base == RID_RIP))
	as->mrm.ofs += 2;  /* Fixup RIP offset for pending fused load. */
      emit_sjcc(as, cc, target);
      return;
    }
  }
  if (LJ_GC64 && LJ_UNLIKELY(as->mrm.base == RID_RIP))
    as->mrm.ofs += 6;  /* Fixup RIP offset for pending fused load. */
  emit_jcc(as, cc, target);
}